

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall HecrSequential_constructRhs_Test::TestBody(HecrSequential_constructRhs_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_168;
  Message local_160;
  double local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  Message local_138;
  size_type local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  vec rhs;
  vec expected_rhs;
  double expected_rhs_values [15];
  double mid;
  double end;
  double t;
  allocator<double> local_41;
  value_type_conflict local_40;
  undefined1 local_38 [8];
  vec prev_layer;
  int size;
  int nt;
  int nx;
  HecrSequential_constructRhs_Test *this_local;
  
  prev_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xf;
  local_40 = -2.0;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,0xf,&local_40,&local_41);
  std::allocator<double>::~allocator(&local_41);
  expected_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xc083aba504ab2b91;
  make_vector((vec *)&rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
              prev_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_,
              (double *)
              &expected_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  construct_rhs((vec *)&gtest_ar.message_,10,10,(vec *)local_38,0.5,f_test,u_test);
  local_130 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_128,"size","rhs.size()",
             (int *)((long)&prev_layer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_158 = max_diff((vec *)&rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(vec *)&gtest_ar.message_);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_150,"max_diff(expected_rhs, rhs)","EPS",&local_158,&EPS);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return;
}

Assistant:

TEST(HecrSequential, constructRhs)
{
    int nx = 10;
    int nt = 10;
    int size = 15;
    vec prev_layer(size, -2.0);
    double t = 0.5;
    double end = -629.4555753109617372408285645;
    double mid = 19.0;
    const double expected_rhs_values[] =
        { end, mid, mid, mid, mid, mid, mid, mid, end, 0, 0, 0, 0, 0, 0 };
    vec expected_rhs = make_vector(size, expected_rhs_values);

    vec rhs = construct_rhs(nx, nt, prev_layer, t, f_test, u_test);

    EXPECT_EQ(size, rhs.size());
    EXPECT_LT(max_diff(expected_rhs, rhs), EPS);
}